

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall ON_SubDEdge::AddFaceToArray(ON_SubDEdge *this,ON_SubDFacePtr face_ptr)

{
  ON_SubDEdge *this_local;
  ON_SubDFacePtr face_ptr_local;
  
  if (this->m_face_count < 2) {
    this->m_face2[this->m_face_count].m_ptr = face_ptr.m_ptr;
  }
  else {
    if ((this->m_facex == (ON_SubDFacePtr *)0x0) ||
       (this->m_facex_capacity + 2 <= (uint)this->m_face_count)) {
      ON_SubDIncrementErrorCount();
      return false;
    }
    this->m_facex[(int)(this->m_face_count - 2)].m_ptr = face_ptr.m_ptr;
  }
  this->m_face_count = this->m_face_count + 1;
  return true;
}

Assistant:

bool ON_SubDEdge::AddFaceToArray(
  ON_SubDFacePtr face_ptr
)
{
  if (m_face_count < 2)
    m_face2[m_face_count] = face_ptr;
  else if (nullptr != m_facex && m_face_count < 2 + m_facex_capacity)
    m_facex[m_face_count - 2] = face_ptr;
  else
  {
    // not enough room in m_facex.
    // If you really are trying to make a non-manifold subd, 
    // then use ON_SubD::GrowEdgeFaceArray().
    return ON_SUBD_RETURN_ERROR(false);
  }
  m_face_count++;
  return true;
}